

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O2

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
HBF::heuristic_basic
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,HBF *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *grid,vector<double,_std::allocator<double>_> *start,
          vector<int,_std::allocator<int>_> *goal)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  pointer pvVar4;
  pointer piVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  int *piVar9;
  pointer pvVar10;
  long lVar11;
  int i_1;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  initializer_list<int> __l;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  allocator_type local_d1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  next_state;
  vector<int,_std::allocator<int>_> next;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  opened;
  _Vector_base<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> *local_50;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  closed;
  
  local_50 = goal;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__,grid);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&closed,grid);
  pvVar10 = (__return_storage_ptr__->
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (__return_storage_ptr__->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (lVar11 = 0; lVar11 != ((long)pvVar4 - (long)pvVar10) / 0x18; lVar11 = lVar11 + 1) {
    piVar5 = *(pointer *)
              ((long)&(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data + 8);
    lVar6 = *(long *)&(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data;
    for (lVar15 = 0; (long)piVar5 - lVar6 >> 2 != lVar15; lVar15 = lVar15 + 1) {
      lVar7 = *(long *)&pvVar10[lVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl;
      if (*(int *)(lVar7 + lVar15 * 4) == 1) {
        *(undefined4 *)(lVar7 + lVar15 * 4) = 999;
      }
    }
  }
  pdVar8 = (start->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  next_state.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44((int)pdVar8[1],(int)*pdVar8);
  __l._M_len = 2;
  __l._M_array = (iterator)&next_state;
  local_d0 = __return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(&next,__l,(allocator_type *)&local_68);
  __l_00._M_len = 1;
  __l_00._M_array = &next;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&opened,__l_00,(allocator_type *)&local_c4);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&next.super__Vector_base<int,_std::allocator<int>_>);
  pdVar8 = (start->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *(undefined4 *)
   (*(long *)&(local_d0->
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[(int)*pdVar8].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data +
   (long)(int)pdVar8[1] * 4) = 1;
  do {
    if (opened.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        opened.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00103b68:
      pvVar10 = (local_d0->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = (local_d0->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (lVar11 = 0; lVar11 != ((long)pvVar4 - (long)pvVar10) / 0x18; lVar11 = lVar11 + 1) {
        piVar5 = *(pointer *)
                  ((long)&(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data + 8);
        lVar6 = *(long *)&(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data;
        for (lVar15 = 0; (long)piVar5 - lVar6 >> 2 != lVar15; lVar15 = lVar15 + 1) {
          lVar7 = *(long *)&pvVar10[lVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl;
          if (*(int *)(lVar7 + lVar15 * 4) == 0) {
            *(undefined4 *)(lVar7 + lVar15 * 4) = 999;
          }
        }
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&opened);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&closed);
      return local_d0;
    }
    std::vector<int,_std::allocator<int>_>::vector
              (&next,opened.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::erase(&opened,(const_iterator)
                    opened.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    iVar1 = *next.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    iVar2 = next.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[1];
    piVar9 = (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((iVar1 == *piVar9) && (iVar2 == piVar9[1])) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&next.super__Vector_base<int,_std::allocator<int>_>);
      goto LAB_00103b68;
    }
    next_state.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    next_state.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    next_state.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c4 = iVar1 + -1;
    __l_01._M_len = 2;
    __l_01._M_array = &local_c4;
    local_c0 = iVar2;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_68,__l_01,&local_d1);
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&next_state,(vector<int,_std::allocator<int>_> *)&local_68);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
    local_c0 = iVar2 + 1;
    __l_02._M_len = 2;
    __l_02._M_array = &local_c4;
    local_c4 = iVar1;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_68,__l_02,&local_d1);
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&next_state,(vector<int,_std::allocator<int>_> *)&local_68);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
    local_c4 = iVar1 + 1;
    __l_03._M_len = 2;
    __l_03._M_array = &local_c4;
    local_c0 = iVar2;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_68,__l_03,&local_d1);
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&next_state,(vector<int,_std::allocator<int>_> *)&local_68);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
    local_c0 = iVar2 + -1;
    __l_04._M_len = 2;
    __l_04._M_array = &local_c4;
    local_c4 = iVar1;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_68,__l_04,&local_d1);
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&next_state,(vector<int,_std::allocator<int>_> *)&local_68);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
    pvVar10 = (local_d0->
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_bc = *(int *)(*(long *)&pvVar10[iVar1].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data + (long)iVar2 * 4) + 1;
    lVar11 = 0;
    for (uVar12 = 0;
        uVar12 < (ulong)(((long)next_state.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)next_state.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar12 = uVar12 + 1) {
      piVar9 = *(int **)((long)&((next_state.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar11);
      uVar14 = (ulong)*piVar9;
      if ((((-1 < (long)uVar14) &&
           (pvVar4 = (grid->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
           uVar14 < (ulong)(((long)(grid->
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) /
                           0x18))) && (uVar3 = piVar9[1], uVar13 = (ulong)uVar3, -1 < (int)uVar3))
         && ((uVar13 < (ulong)((long)*(pointer *)
                                      ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>
                                              )._M_impl.super__Vector_impl_data + 8) -
                               *(long *)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data >> 2) &&
             (closed.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar14].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [uVar13] == 0 &&
              *(int *)(*(long *)&pvVar10[uVar14].super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data + uVar13 * 4) == 0)))) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back(&opened,(value_type *)
                            ((long)&((next_state.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start + lVar11));
        pvVar10 = (local_d0->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        *(int *)(*(long *)&pvVar10[uVar14].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + uVar13 * 4) = local_bc;
        closed.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar14].
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar13] = 1;
      }
      lVar11 = lVar11 + 0x18;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&next_state);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&next.super__Vector_base<int,_std::allocator<int>_>);
  } while( true );
}

Assistant:

vector<vector<int> > HBF::heuristic_basic(vector<vector<int> > grid, vector<double> start, vector<int> goal){
    /*
    Create the heuristic function for A star searches on a grid, given start position and goal position.
    */

    vector<vector<int> > heuristic = grid;
    vector<vector<int> > closed = grid;

    // give obstacles a very large value
    for (int i = 0; i < heuristic.size(); i ++){
        for (int j = 0; j < heuristic[0].size(); j ++){
            if (heuristic[i][j] == 1){
                heuristic[i][j] = 999;
            }
        }
    }

    vector<vector<int>> opened = {{int(start[0]),int(start[1])}};

    heuristic[int(start[0])][int(start[1])] = 1;

    while (!opened.empty() ) {

        vector<int> next = opened[0]; //grab first element
        opened.erase(opened.begin()); //pop first element

        int x = next[0];
        int y = next[1];

        if (x == goal[0] && y == goal[1]) {
            break;
        }

        vector<vector<int>> next_state;
        next_state.push_back({x-1,y});
        next_state.push_back({x,y+1});
        next_state.push_back({x+1,y});
        next_state.push_back({x,y-1});

        int g = heuristic[x][y];

        for (int i = 0; i < next_state.size(); i++) {

            int x2 = next_state[i][0];
            int y2 = next_state[i][1];
            int temp = 0;

            if ((x2 < 0 || x2 >= grid.size()) || (y2 < 0 || y2 >= grid[0].size())) {
                //invalid cell
                continue;
            }

            if (heuristic[idx(x2)][idx(y2)] == 0 & closed[x2][y2] == 0) {
                temp += 1;
                opened.push_back(next_state[i]);
                heuristic[idx(x2)][idx(y2)] = g + max(temp, 1);
                closed[x2][y2] = 1;
            }

        }

    }

    // any remaining unreached cell takes on 999
    for (int i = 0; i < heuristic.size(); i ++){
        for (int j = 0; j < heuristic[0].size(); j ++){
            if (heuristic[i][j] == 0){
                heuristic[i][j] = 999;
            }
        }
    }

    return heuristic;

}